

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O3

void __thiscall fanuc_post_processor::generate_LS::left_command(generate_LS *this)

{
  pointer paVar1;
  pointer paVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  undefined8 *puVar7;
  int iVar8;
  ulong uVar9;
  long *plVar10;
  ulong *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint __uval;
  string __str_1;
  string __str;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  ulong local_180;
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  ulong local_38;
  
  paVar1 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar2 = (this->pos_).
           super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)paVar1 - (long)paVar2 >> 3;
  iVar8 = (int)lVar5 * 0x49249249 + this->line_cnt + 2;
  this->line_cnt = iVar8;
  if (paVar1 == paVar2) {
    uVar9 = lVar5 * 0x6db6db6db6db6db7;
  }
  else {
    local_180 = 0;
    do {
      uVar14 = this->line_cnt + (int)(local_180 + 1);
      uVar12 = -uVar14;
      if (0 < (int)uVar14) {
        uVar12 = uVar14;
      }
      uVar13 = 1;
      if (9 < uVar12) {
        uVar9 = (ulong)uVar12;
        uVar3 = 4;
        do {
          uVar13 = uVar3;
          uVar4 = (uint)uVar9;
          if (uVar4 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_0010337f;
          }
          if (uVar4 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_0010337f;
          }
          if (uVar4 < 10000) goto LAB_0010337f;
          uVar9 = uVar9 / 10000;
          uVar3 = uVar13 + 4;
        } while (99999 < uVar4);
        uVar13 = uVar13 + 1;
      }
LAB_0010337f:
      local_78[0] = local_68;
      local_38 = local_180;
      local_180 = local_180 + 1;
      std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar13 - (char)((int)uVar14 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_78[0]),uVar13,uVar12);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1060b6);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_108 = *plVar10;
        lStack_100 = plVar6[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *plVar10;
        local_118 = (long *)*plVar6;
      }
      local_110 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_e8 = *plVar10;
        lStack_e0 = plVar6[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar10;
        local_f8 = (long *)*plVar6;
      }
      local_f0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
      puVar11 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar11) {
        local_190 = *puVar11;
        lStack_188 = plVar6[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *puVar11;
        local_1a0 = (ulong *)*plVar6;
      }
      local_198 = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      uVar12 = 1;
      if (8 < local_38) {
        uVar9 = local_180;
        uVar14 = 4;
        do {
          uVar12 = uVar14;
          uVar13 = (uint)uVar9;
          if (uVar13 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_0010355c;
          }
          if (uVar13 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_0010355c;
          }
          if (uVar13 < 10000) goto LAB_0010355c;
          uVar9 = (uVar9 & 0xffffffff) / 10000;
          uVar14 = uVar12 + 4;
        } while (99999 < uVar13);
        uVar12 = uVar12 + 1;
      }
LAB_0010355c:
      local_158 = local_148;
      std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar12);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_158,uVar12,(uint)local_180);
      uVar9 = 0xf;
      if (local_1a0 != &local_190) {
        uVar9 = local_190;
      }
      if (uVar9 < (ulong)(local_150 + local_198)) {
        uVar9 = 0xf;
        if (local_158 != local_148) {
          uVar9 = local_148[0];
        }
        if (uVar9 < (ulong)(local_150 + local_198)) goto LAB_001035d7;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_1a0);
      }
      else {
LAB_001035d7:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_158);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_168 = *plVar6;
        uStack_160 = puVar7[3];
        local_178 = &local_168;
      }
      else {
        local_168 = *plVar6;
        local_178 = (long *)*puVar7;
      }
      local_170 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_48 = *plVar10;
        lStack_40 = plVar6[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar10;
        local_58 = (long *)*plVar6;
      }
      local_50 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_58,(ulong)(this->velocity_)._M_dataplus._M_p);
      local_d8 = &local_c8;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_c8 = *plVar10;
        lStack_c0 = plVar6[3];
      }
      else {
        local_c8 = *plVar10;
        local_d8 = (long *)*plVar6;
      }
      local_d0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar6[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)(this->cnt_)._M_dataplus._M_p);
      local_98 = &local_88;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar6[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_138 = &local_128;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_128 = *plVar10;
        lStack_120 = plVar6[3];
      }
      else {
        local_128 = *plVar10;
        local_138 = (long *)*plVar6;
      }
      local_130 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_138);
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178,local_168 + 1);
      }
      if (local_158 != local_148) {
        operator_delete(local_158,local_148[0] + 1);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      uVar9 = ((long)(this->pos_).
                     super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->pos_).
                     super__Vector_base<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    } while (local_180 <= uVar9 && uVar9 - local_180 != 0);
    iVar8 = this->line_cnt;
  }
  this->line_cnt = (int)uVar9 + iVar8;
  return;
}

Assistant:

void generate_LS::left_command() {
        line_cnt = line_cnt - pos_.size() + 2;
        for(int i = 0; i < pos_.size(); i++){
            program.append("\t"+std::to_string(i+line_cnt+1)+":L"+" P["+std::to_string(i+1)+"] "+velocity_+"mm/sec "+cnt_+";\n");

        }
        line_cnt += pos_.size();
    }